

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::_InternalParse
          (TreeEnsembleParameters_TreeNode *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *this_00;
  bool bVar1;
  uint64_t uVar2;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  double dVar3;
  uint64_t val;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  TreeEnsembleParameters_TreeNode *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_003d75dc:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag
                          ((char *)ctx_local,(uint32_t *)((long)&val + 4),0);
    tag_00 = val._4_4_;
    switch(val._4_4_ >> 3) {
    case 1:
      if ((val._4_4_ & 0xff) != 8) break;
      uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
      this->treeid_ = uVar2;
      goto joined_r0x003d7823;
    case 2:
      if ((val._4_4_ & 0xff) == 0x10) {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        this->nodeid_ = uVar2;
        goto joined_r0x003d7823;
      }
      break;
    case 3:
      if ((val._4_4_ & 0xff) == 0x18) {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        _internal_set_nodebehavior(this,(TreeEnsembleParameters_TreeNode_TreeNodeBehavior)uVar2);
        goto LAB_003d75dc;
      }
      break;
    default:
      break;
    case 10:
      if ((val._4_4_ & 0xff) == 0x50) {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        this->branchfeatureindex_ = uVar2;
        goto joined_r0x003d7823;
      }
      break;
    case 0xb:
      if ((val._4_4_ & 0xff) == 0x59) {
        dVar3 = google::protobuf::internal::UnalignedLoad<double>((char *)ctx_local);
        this->branchfeaturevalue_ = dVar3;
        ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
        goto LAB_003d75dc;
      }
      break;
    case 0xc:
      if ((val._4_4_ & 0xff) == 0x60) {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        this->truechildnodeid_ = uVar2;
        goto joined_r0x003d7823;
      }
      break;
    case 0xd:
      if ((val._4_4_ & 0xff) == 0x68) {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        this->falsechildnodeid_ = uVar2;
        goto joined_r0x003d7823;
      }
      break;
    case 0xe:
      if ((val._4_4_ & 0xff) == 0x70) {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        this->missingvaluetrackstruechild_ = uVar2 != 0;
        goto joined_r0x003d7823;
      }
      break;
    case 0x14:
      if ((val._4_4_ & 0xff) == 0xa2) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 6);
        do {
          this_00 = pPStack_20;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 2);
          msg = _internal_add_evaluationinfo(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::ParseMessage
                                (this_00,&msg->super_MessageLite,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) {
            return (char *)0x0;
          }
          bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar1) &&
                (bVar1 = google::protobuf::internal::ExpectTag<162u>((char *)ctx_local), bVar1));
        goto LAB_003d75dc;
      }
      break;
    case 0x1e:
      if ((val._4_4_ & 0xff) == 0xf1) {
        dVar3 = google::protobuf::internal::UnalignedLoad<double>((char *)ctx_local);
        this->relativehitrate_ = dVar3;
        ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
        goto LAB_003d75dc;
      }
    }
    if ((val._4_4_ == 0) || ((val._4_4_ & 7) == 4)) {
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&pPStack_20->super_EpsCopyInputStream,val._4_4_);
      return (char *)ctx_local;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>
                        (&(this->super_MessageLite)._internal_metadata_);
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (tag_00,unknown,(char *)ctx_local,pPStack_20);
joined_r0x003d7823:
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* TreeEnsembleParameters_TreeNode::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint64 treeId = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          treeid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // uint64 nodeId = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          nodeid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.TreeEnsembleParameters.TreeNode.TreeNodeBehavior nodeBehavior = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_nodebehavior(static_cast<::CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior>(val));
        } else
          goto handle_unusual;
        continue;
      // uint64 branchFeatureIndex = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 80)) {
          branchfeatureindex_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // double branchFeatureValue = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 89)) {
          branchfeaturevalue_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // uint64 trueChildNodeId = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 96)) {
          truechildnodeid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // uint64 falseChildNodeId = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 104)) {
          falsechildnodeid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool missingValueTracksTrueChild = 14;
      case 14:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 112)) {
          missingvaluetrackstruechild_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo evaluationInfo = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_evaluationinfo(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<162>(ptr));
        } else
          goto handle_unusual;
        continue;
      // double relativeHitRate = 30;
      case 30:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 241)) {
          relativehitrate_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}